

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

string * __thiscall
wabt::Token::to_string_clamp_abi_cxx11_
          (string *__return_storage_ptr__,Token *this,size_t max_length)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string s;
  size_t max_length_local;
  Token *this_local;
  
  s.field_2._8_8_ = max_length;
  to_string_abi_cxx11_((string *)local_40,this);
  uVar1 = std::__cxx11::string::length();
  if ((ulong)s.field_2._8_8_ < uVar1) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)local_40);
    std::operator+(__return_storage_ptr__,&local_60,"...");
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string_clamp(size_t max_length) const {
  std::string s = to_string();
  if (s.length() > max_length) {
    return s.substr(0, max_length - 3) + "...";
  } else {
    return s;
  }
}